

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O3

bool __thiscall hwtest::pgraph::MthdCelsiusLightEnable::is_valid_val(MthdCelsiusLightEnable *this)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = (ulong)(this->super_SingleMthdTest).super_MthdTest.val;
  if (0xffff < uVar4) {
    return false;
  }
  lVar3 = 0x3e;
  bVar2 = 0;
  do {
    uVar5 = uVar4 << ((byte)lVar3 & 0x3f);
    bVar1 = (bool)(0x3fffffffffffffff < uVar5 & bVar2);
    if (bVar1) break;
    bVar2 = bVar2 | uVar5 < 0x4000000000000000;
    lVar3 = lVar3 + -2;
  } while (lVar3 != 0x2e);
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool is_valid_val() override {
		if (val & ~0xffff)
			return false;
		bool off = false;
		for (int i = 0; i < 8; i++) {
			int mode = extr(val, i * 2, 2);
			if (off && mode != 0)
				return false;
			if (mode == 0)
				off = true;
		}
		return true;
	}